

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayOperations.cc
# Opt level: O2

int normaliseArray(double *inputVector,uint *outputVector,int vectorLength)

{
  int iVar1;
  int i_1;
  int iVar2;
  void *__ptr;
  int i;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong __nmemb;
  double dVar7;
  
  if (vectorLength < 1) {
    iVar4 = 0;
  }
  else {
    __nmemb = (ulong)(uint)vectorLength;
    __ptr = calloc(__nmemb,4);
    dVar7 = floor(*inputVector);
    iVar5 = (int)dVar7;
    iVar4 = iVar5;
    for (uVar3 = 0; __nmemb != uVar3; uVar3 = uVar3 + 1) {
      dVar7 = floor(inputVector[uVar3]);
      iVar2 = (int)dVar7;
      iVar1 = iVar2;
      if (iVar2 < iVar5) {
        iVar1 = iVar5;
      }
      iVar6 = iVar4;
      if (iVar2 <= iVar4) {
        iVar6 = iVar2;
      }
      *(int *)((long)__ptr + uVar3 * 4) = iVar2;
      if (iVar4 <= iVar2) {
        iVar5 = iVar1;
      }
      iVar4 = iVar6;
    }
    for (uVar3 = 0; __nmemb != uVar3; uVar3 = uVar3 + 1) {
      outputVector[uVar3] = *(int *)((long)__ptr + uVar3 * 4) - iVar4;
    }
    iVar4 = (iVar5 - iVar4) + 1;
    free(__ptr);
  }
  return iVar4;
}

Assistant:

int normaliseArray(double *inputVector, uint *outputVector, int vectorLength) {
    int maxVal = 0;

    if (vectorLength > 0) {
        int* tempVector = (int*) calloc(vectorLength,sizeof(int));
        int minVal = (int) floor(inputVector[0]);
        maxVal = (int) floor(inputVector[0]);

        for (int i = 0; i < vectorLength; i++) {
            int currentValue = (int) floor(inputVector[i]);
            tempVector[i] = currentValue;

            if (currentValue < minVal) {
                minVal = currentValue;
            } else if (currentValue > maxVal) {
                maxVal = currentValue;
            }
        }/*for loop over vector*/

        for (int i = 0; i < vectorLength; i++) {
            outputVector[i] = tempVector[i] - minVal;
        }

        maxVal = (maxVal - minVal) + 1;

        free(tempVector);
        
    }

    return maxVal;
}